

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall VariationalBayesEstimatorOnLDA::runIteraions(VariationalBayesEstimatorOnLDA *this)

{
  ostream *poVar1;
  uint uVar2;
  double extraout_XMM0_Qa;
  double thisVariationalLowerBound;
  double local_38;
  
  local_38 = 0.0;
  uVar2 = 1;
  do {
    thisVariationalLowerBound = local_38;
    (*this->_vptr_VariationalBayesEstimatorOnLDA[6])(this);
    (*this->_vptr_VariationalBayesEstimatorOnLDA[7])(this);
    (*this->_vptr_VariationalBayesEstimatorOnLDA[10])(this);
    thisVariationalLowerBound = extraout_XMM0_Qa;
    std::operator<<((ostream *)&std::cout,"VLB");
    poVar1 = std::ostream::_M_insert<double>(thisVariationalLowerBound);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->_VLBTimeSeries,&thisVariationalLowerBound);
    if (NAN(thisVariationalLowerBound)) {
LAB_0010fab8:
      (*this->_vptr_VariationalBayesEstimatorOnLDA[4])(this);
      poVar1 = std::operator<<((ostream *)&std::cout,"iter:");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      return;
    }
    if ((1 < uVar2) &&
       ((thisVariationalLowerBound - local_38) / ABS(thisVariationalLowerBound) <
        this->_convergenceDiterminationRate)) {
      this->_variationalLowerBound = thisVariationalLowerBound;
      goto LAB_0010fab8;
    }
    (*this->_vptr_VariationalBayesEstimatorOnLDA[9])(this);
    local_38 = thisVariationalLowerBound;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void VariationalBayesEstimatorOnLDA::runIteraions(){//{{{
    double prevVariationalLowerBound = 0;
    double thisVariationalLowerBound = 0;
    unsigned int count = 0;
    while(1){
        prevVariationalLowerBound = thisVariationalLowerBound;
        this->updateQz();
        this->updateNEx();
        thisVariationalLowerBound = this->calculateVariationalLowerBound();
        cout<<"VLB"<<thisVariationalLowerBound<<endl;
        _VLBTimeSeries.push_back(thisVariationalLowerBound);
        count++;
        if(std::isnan(thisVariationalLowerBound))break;
        if(count<2){
        }else if((thisVariationalLowerBound - prevVariationalLowerBound) / abs(thisVariationalLowerBound) < _convergenceDiterminationRate){
            _variationalLowerBound = thisVariationalLowerBound;
            break;
        }
        this->updateHyperParameters();
    }
    this->calculateEx();
    cout<<"iter:"<<count<<endl;
}